

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o_init.c
# Opt level: O0

void setgemprobs(d_level *dlev)

{
  int iVar1;
  uint uVar2;
  xchar xVar3;
  xchar xVar4;
  char cVar5;
  uint uVar6;
  int local_24;
  int local_1c;
  int lev;
  int first;
  int j;
  d_level *dlev_local;
  
  if (dlev == (d_level *)0x0) {
    local_1c = 0;
  }
  else {
    xVar3 = ledger_no(dlev);
    xVar4 = maxledgerno();
    if (xVar4 < xVar3) {
      cVar5 = maxledgerno();
    }
    else {
      cVar5 = ledger_no(dlev);
    }
    local_24 = (int)cVar5;
    local_1c = local_24;
  }
  iVar1 = bases[0xd];
  for (lev = 0; lev < 9 - local_1c / 3; lev = lev + 1) {
    objects[iVar1 + lev].oc_prob = 0;
  }
  uVar6 = lev + iVar1;
  uVar2 = uVar6;
  if (((0x205 < (int)uVar6) || (objects[(int)uVar6].oc_class != '\r')) ||
     (obj_descr[objects[(int)uVar6].oc_name_idx].oc_name == (char *)0x0)) {
    raw_printf("Not enough gems? - first=%d j=%d LAST_GEM=%d\n",(ulong)uVar6,(ulong)(uint)lev,0x205)
    ;
  }
  while (lev = uVar2, lev < 0x206) {
    objects[lev].oc_prob = (short)((int)((lev + 0xab) - uVar6) / (int)(0x206 - uVar6));
    uVar2 = lev + 1;
  }
  return;
}

Assistant:

static void setgemprobs(const d_level *dlev)
{
	int j, first, lev;

	if (dlev)
	    lev = (ledger_no(dlev) > maxledgerno())
				? maxledgerno() : ledger_no(dlev);
	else
	    lev = 0;
	first = bases[GEM_CLASS];

	for (j = 0; j < 9-lev/3; j++)
		objects[first+j].oc_prob = 0;
	first += j;
	if (first > LAST_GEM || objects[first].oc_class != GEM_CLASS ||
	    OBJ_NAME(objects[first]) == NULL) {
		raw_printf("Not enough gems? - first=%d j=%d LAST_GEM=%d\n",
			first, j, LAST_GEM);
	    }
	for (j = first; j <= LAST_GEM; j++)
		objects[j].oc_prob = (171+j-first)/(LAST_GEM+1-first);
}